

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# point_cloud_decoder.cc
# Opt level: O2

Status * __thiscall
draco::PointCloudDecoder::DecodeStep2(Status *__return_storage_ptr__,PointCloudDecoder *this)

{
  int iVar1;
  allocator<char> local_31;
  string local_30 [32];
  
  iVar1 = (*this->_vptr_PointCloudDecoder[7])(this);
  if ((char)iVar1 == '\0') {
    std::__cxx11::string::string<std::allocator<char>>
              (local_30,"Failed to decode point attributes.",&local_31);
    __return_storage_ptr__->code_ = DRACO_ERROR;
    std::__cxx11::string::string((string *)&__return_storage_ptr__->error_msg_,local_30);
    std::__cxx11::string::~string(local_30);
  }
  else {
    __return_storage_ptr__->code_ = OK;
    (__return_storage_ptr__->error_msg_)._M_dataplus._M_p =
         (pointer)&(__return_storage_ptr__->error_msg_).field_2;
    (__return_storage_ptr__->error_msg_)._M_string_length = 0;
    (__return_storage_ptr__->error_msg_).field_2._M_local_buf[0] = '\0';
  }
  return __return_storage_ptr__;
}

Assistant:

Status PointCloudDecoder::DecodeStep2() {
  if (!DecodePointAttributesStep2()) {
    return Status(Status::DRACO_ERROR, "Failed to decode point attributes.");
  }
  return OkStatus();
}